

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,ExtendedClassDeclaration *ptr)

{
  Declaration *second;
  bool bVar1;
  vector<Declaration_*,_std::allocator<Declaration_*>_> *this_00;
  reference ppDVar2;
  Declaration *i;
  iterator __end1;
  iterator __begin1;
  vector<Declaration_*,_std::allocator<Declaration_*>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ExtendedClassDeclaration *local_18;
  ExtendedClassDeclaration *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (ExtendedClassDeclaration *)this;
  std::operator+(&local_78,"Class Declaration: ",(ptr->super_Class_declaration).name);
  std::operator+(&local_58,&local_78,". Extended by ");
  std::operator+(&local_38,&local_58,local_18->base);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = &(local_18->super_Class_declaration).decls;
  __end1 = std::vector<Declaration_*,_std::allocator<Declaration_*>_>::begin(this_00);
  i = (Declaration *)std::vector<Declaration_*,_std::allocator<Declaration_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Declaration_**,_std::vector<Declaration_*,_std::allocator<Declaration_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<Declaration_**,_std::vector<Declaration_*,_std::allocator<Declaration_*>_>_>
              ::operator*(&__end1);
    second = *ppDVar2;
    arrow(this,local_18,second);
    (**(second->super_Base)._vptr_Base)(second,this);
    __gnu_cxx::
    __normal_iterator<Declaration_**,_std::vector<Declaration_*,_std::allocator<Declaration_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void gv_visitor::visit(ExtendedClassDeclaration* ptr) {
    box(ptr, "Class Declaration: " + *ptr->name + ". Extended by " + *ptr->base);

    for(auto i : ptr->decls) {
        arrow(ptr, i);
        i->accept(this);
    }
    
    //name, base
}